

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

float __thiscall llvm::detail::IEEEFloat::convertToFloat(IEEEFloat *this)

{
  undefined8 uVar1;
  fltSemantics *pfVar2;
  APInt api;
  fltSemantics *local_18;
  Significand local_10;
  
  if (this->semantics == (fltSemantics *)semIEEEsingle) {
    bitcastToAPInt((IEEEFloat *)&local_18);
    pfVar2 = (fltSemantics *)&local_18;
    if (0x40 < (uint)local_10.part._0_4_) {
      pfVar2 = local_18;
    }
    uVar1._0_2_ = pfVar2->maxExponent;
    uVar1._2_2_ = pfVar2->minExponent;
    uVar1._4_4_ = pfVar2->precision;
    if (local_18 != (fltSemantics *)0x0 && 0x40 < (uint)local_10.part._0_4_) {
      operator_delete__(local_18);
    }
    return (float)uVar1;
  }
  __assert_fail("semantics == (const llvm::fltSemantics*)&semIEEEsingle && \"Float semantics are not IEEEsingle\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xbcd,"float llvm::detail::IEEEFloat::convertToFloat() const");
}

Assistant:

float IEEEFloat::convertToFloat() const {
  assert(semantics == (const llvm::fltSemantics*)&semIEEEsingle &&
         "Float semantics are not IEEEsingle");
  APInt api = bitcastToAPInt();
  return api.bitsToFloat();
}